

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pMVar2;
  pointer pMVar3;
  StringRef text;
  StringRef text_00;
  StringRef text_01;
  StringRef text_02;
  char *pcVar4;
  SourceLineInfo *pSVar5;
  int iVar6;
  OfType OVar7;
  undefined8 in_RCX;
  XmlFormatting fmt;
  XmlWriter *pXVar8;
  char cVar9;
  SourceLineInfo *sourceInfo;
  bool bVar10;
  StringRef name;
  StringRef name_00;
  StringRef attribute;
  ScopedElement t;
  string local_98;
  XmlReporter *local_78;
  undefined4 local_6c;
  string local_68;
  ScopedElement local_48;
  undefined8 local_38;
  
  local_78 = this;
  iVar6 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  local_6c = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  fmt = (XmlFormatting)&local_98;
  if (((char)iVar6 == '\0') &&
     ((OVar7 = (assertionStats->assertionResult).m_resultData.resultType, (OVar7 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar7 == Warning) {
      local_6c = 0;
      goto LAB_00141d43;
    }
LAB_00141ea9:
    if ((OVar7 != ExplicitSkip) && (OVar7 != Warning)) {
      return;
    }
  }
  else {
LAB_00141d43:
    pMVar2 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_38 = assertionStats;
    if (pMVar2 != pMVar3) {
      pXVar8 = &local_78->m_xml;
      cVar9 = (char)local_6c;
      sourceInfo = &pMVar2->lineInfo;
      do {
        if (*(int *)&sourceInfo[1].file == 1 && cVar9 == '\x01') {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Info","");
          XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)pXVar8,fmt);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          writeSourceInfo(local_78,sourceInfo);
          XmlWriter::writeText
                    ((XmlWriter *)local_68._M_dataplus._M_p,(StringRef)sourceInfo[-2],Newline|Indent
                    );
LAB_00141e7a:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_68);
        }
        else if (*(int *)&sourceInfo[1].file == 2) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Warning","");
          XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)pXVar8,fmt);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          writeSourceInfo(local_78,sourceInfo);
          XmlWriter::writeText
                    ((XmlWriter *)local_68._M_dataplus._M_p,(StringRef)sourceInfo[-2],Newline|Indent
                    );
          goto LAB_00141e7a;
        }
        pSVar5 = sourceInfo + 1;
        sourceInfo = (SourceLineInfo *)&sourceInfo[4].line;
      } while ((pointer)&pSVar5->line != pMVar3);
    }
    assertionStats = (AssertionStats *)local_38;
    if ((char)local_6c == '\0') {
      OVar7 = *(OfType *)(local_38 + 0x88);
      goto LAB_00141ea9;
    }
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Expression","");
    pXVar8 = &local_78->m_xml;
    XmlWriter::startElement(pXVar8,&local_98,Newline|Indent);
    bVar10 = ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok;
    pcVar4 = "hello.value() == false";
    if (bVar10) {
      pcVar4 = "world.value() == true";
    }
    attribute.m_start = pcVar4 + 0x11;
    attribute.m_size = (ulong)bVar10 ^ 5;
    name.m_size = 7;
    name.m_start = "success";
    XmlWriter::writeAttribute(pXVar8,name,attribute);
    name_00.m_size = 4;
    name_00.m_start = "type";
    XmlWriter::writeAttribute(pXVar8,name_00,(assertionStats->assertionResult).m_info.macroName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_98._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(local_78,(SourceLineInfo *)&local_98);
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Original","");
    XmlWriter::scopedElement((XmlWriter *)&local_48,(string *)pXVar8,fmt);
    AssertionResult::getExpression_abi_cxx11_(&local_68,&assertionStats->assertionResult);
    text_01.m_size = local_68._M_string_length;
    text_01.m_start = local_68._M_dataplus._M_p;
    XmlWriter::writeText(local_48.m_writer,text_01,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1))
      ;
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Expanded","");
    XmlWriter::scopedElement((XmlWriter *)&local_48,(string *)pXVar8,fmt);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_68,&assertionStats->assertionResult);
    text_02.m_size = local_68._M_string_length;
    text_02.m_start = local_68._M_dataplus._M_p;
    XmlWriter::writeText(local_48.m_writer,text_02,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1))
      ;
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  OVar7 = (assertionStats->assertionResult).m_resultData.resultType;
  if (OVar7 < ExplicitFailure) {
    if (OVar7 == Info) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Info","");
      XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)&local_78->m_xml,fmt);
      text_00.m_start = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      text_00.m_size = (assertionStats->assertionResult).m_resultData.message._M_string_length;
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,text_00,Newline|Indent);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014221a;
    }
    if (OVar7 != ExplicitSkip) goto LAB_0014221a;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Skip","");
    pXVar8 = &local_78->m_xml;
    XmlWriter::startElement(pXVar8,&local_98,Newline|Indent);
  }
  else if (OVar7 == ExplicitFailure) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Failure","");
    pXVar8 = &local_78->m_xml;
    XmlWriter::startElement(pXVar8,&local_98,Newline|Indent);
  }
  else if (OVar7 == FatalErrorCondition) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"FatalErrorCondition","");
    pXVar8 = &local_78->m_xml;
    XmlWriter::startElement(pXVar8,&local_98,Newline|Indent);
  }
  else {
    if (OVar7 != ThrewException) goto LAB_0014221a;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Exception","");
    pXVar8 = &local_78->m_xml;
    XmlWriter::startElement(pXVar8,&local_98,Newline|Indent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_98._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  writeSourceInfo(local_78,(SourceLineInfo *)&local_98);
  text.m_start = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
  text.m_size = (assertionStats->assertionResult).m_resultData.message._M_string_length;
  XmlWriter::writeText(pXVar8,text,Newline|Indent);
  XmlWriter::endElement(pXVar8,Newline|Indent);
LAB_0014221a:
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement(&local_78->m_xml,Newline|Indent);
  }
  return;
}

Assistant:

void XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    auto t = m_xml.scopedElement( "Info" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    auto t = m_xml.scopedElement( "Warning" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if ( !includeResults && result.getResultType() != ResultWas::Warning &&
             result.getResultType() != ResultWas::ExplicitSkip ) {
            return;
        }

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success"_sr, result.succeeded() )
                .writeAttribute( "type"_sr, result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                     .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::ExplicitSkip:
                m_xml.startElement( "Skip" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();
    }